

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectsource.cc
# Opt level: O1

Status * __thiscall
google::protobuf::util::converter::ProtoStreamObjectSource::IncrementRecursionDepth
          (Status *__return_storage_ptr__,ProtoStreamObjectSource *this,StringPiece type_name,
          StringPiece field_name)

{
  int iVar1;
  StringPiece error_message;
  AlphaNum *in_stack_fffffffffffffec8;
  char *local_130;
  undefined8 local_128;
  AlphaNum local_100;
  AlphaNum local_d0;
  AlphaNum local_a0;
  AlphaNum local_70;
  string local_40;
  
  local_a0.piece_size_ = field_name.length_;
  local_a0.piece_data_ = field_name.ptr_;
  local_100.piece_size_ = type_name.length_;
  local_100.piece_data_ = type_name.ptr_;
  iVar1 = this->recursion_depth_;
  this->recursion_depth_ = iVar1 + 1;
  if (iVar1 < this->max_recursion_depth_) {
    Status::Status(__return_storage_ptr__);
  }
  else {
    local_130 = "Message too deep. Max recursion depth reached for type \'";
    local_128 = 0x38;
    local_d0.piece_data_ = "\', field \'";
    local_d0.piece_size_ = 10;
    local_70.piece_data_ = "\'";
    local_70.piece_size_ = 1;
    StrCat_abi_cxx11_(&local_40,(protobuf *)&local_130,&local_100,&local_d0,&local_a0,&local_70,
                      in_stack_fffffffffffffec8);
    error_message.length_ = local_40._M_string_length;
    error_message.ptr_ = local_40._M_dataplus._M_p;
    if ((long)local_40._M_string_length < 0) {
      StringPiece::LogFatalSizeTooBig(local_40._M_string_length,"size_t to int conversion");
    }
    Status::Status(__return_storage_ptr__,INVALID_ARGUMENT,error_message);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Status ProtoStreamObjectSource::IncrementRecursionDepth(
    StringPiece type_name, StringPiece field_name) const {
  if (++recursion_depth_ > max_recursion_depth_) {
    return Status(
        util::error::INVALID_ARGUMENT,
        StrCat("Message too deep. Max recursion depth reached for type '",
                     type_name, "', field '", field_name, "'"));
  }
  return util::Status();
}